

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::MergeFrom
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  uint32 uVar1;
  int32 iVar2;
  void *pvVar3;
  LogMessage *other;
  ValueUnion VVar4;
  LogFinisher local_61;
  ValueUnion local_60;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb81d);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 0x1e) {
    if (uVar1 == 10) {
      if (uVar1 == 10) {
        local_60 = from->value_;
      }
      else {
        local_60.doublevalue_ = 0.0;
      }
      if (this->_oneof_case_[0] != 10) {
        clear_value(this);
        this->_oneof_case_[0] = 10;
      }
      (this->value_).doublevalue_ = (double)local_60;
    }
    else if (uVar1 == 0x14) {
      if (uVar1 != 0x14) {
        VVar4 = (ValueUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      }
      else {
        VVar4 = from->value_;
      }
      if (this->_oneof_case_[0] != 0x14) {
        clear_value(this);
        this->_oneof_case_[0] = 0x14;
        this->value_ = (ValueUnion)
                       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      }
      if ((string *)(this->value_).longvalue_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (&(this->value_).stringvalue_,(string *)VVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)(this->value_).longvalue_);
      }
    }
  }
  else if (uVar1 == 0x1e) {
    iVar2 = (from->value_).intvalue_;
    if (this->_oneof_case_[0] != 0x1e) {
      clear_value(this);
      this->_oneof_case_[0] = 0x1e;
    }
    (this->value_).intvalue_ = iVar2;
  }
  else if (uVar1 == 0x28) {
    if (uVar1 == 0x28) {
      VVar4 = from->value_;
    }
    else {
      VVar4.doublevalue_ = 0.0;
    }
    if (this->_oneof_case_[0] != 0x28) {
      clear_value(this);
      this->_oneof_case_[0] = 0x28;
    }
    this->value_ = VVar4;
  }
  else if (uVar1 == 0x32) {
    iVar2 = (from->value_).intvalue_;
    if (this->_oneof_case_[0] != 0x32) {
      clear_value(this);
      this->_oneof_case_[0] = 0x32;
    }
    (this->value_).boolvalue_ = SUB41(iVar2,0);
  }
  return;
}

Assistant:

void CustomLayerParams_CustomLayerParamValue::MergeFrom(const CustomLayerParams_CustomLayerParamValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kDoubleValue: {
      set_doublevalue(from.doublevalue());
      break;
    }
    case kStringValue: {
      set_stringvalue(from.stringvalue());
      break;
    }
    case kIntValue: {
      set_intvalue(from.intvalue());
      break;
    }
    case kLongValue: {
      set_longvalue(from.longvalue());
      break;
    }
    case kBoolValue: {
      set_boolvalue(from.boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
}